

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

uint64_t phosg::start_time_for_pid(pid_t pid,bool allow_zombie)

{
  bool bVar1;
  cannot_stat_file *e;
  undefined1 local_d0 [40];
  stat st;
  uint64_t start_time;
  bool allow_zombie_local;
  uint64_t uStack_10;
  pid_t pid_local;
  
  string_printf_abi_cxx11_((string *)local_d0,"/proc/%d",(ulong)(uint)pid);
  stat(local_d0 + 0x20,(stat *)local_d0);
  ::std::__cxx11::string::~string((string *)local_d0);
  st.__glibc_reserved[2] = st.st_atim.tv_nsec * 1000000000 + st.st_mtim.tv_sec;
  if ((allow_zombie) || (bVar1 = pid_is_zombie(pid), !bVar1)) {
    uStack_10 = st.__glibc_reserved[2];
  }
  else {
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

uint64_t start_time_for_pid(pid_t pid, bool allow_zombie) {
#ifdef PHOSG_MACOS
  (void)allow_zombie;

  struct proc_taskallinfo ti;
  int ret = proc_pidinfo(pid, PROC_PIDTASKALLINFO, 0, &ti, sizeof(ti));
  if (ret <= 0) {
    if (errno == ESRCH) {
      return 0;
    }
    throw runtime_error("can\'t get start time for pid " + to_string(pid) +
        ": " + string_for_error(errno));
  }
  if (static_cast<size_t>(ret) < sizeof(ti)) {
    throw runtime_error("can\'t get start time for pid " + to_string(pid) +
        ": " + string_for_error(errno));
  }

  return (uint64_t)ti.pbsd.pbi_start_tvsec * 1000000 +
      (uint64_t)ti.pbsd.pbi_start_tvusec;

#else
  uint64_t start_time;
  try {
    struct stat st = stat(string_printf("/proc/%d", pid));
    start_time = (uint64_t)st.st_mtim.tv_sec * 1000000000 +
        (uint64_t)st.st_mtim.tv_nsec;
  } catch (const cannot_stat_file& e) {
    return 0;
  }

  if (!allow_zombie && pid_is_zombie(pid)) {
    return 0;
  }
  return start_time;
#endif
}